

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

bool testing::internal::
     ParameterizedTestSuiteInfo<get_proj_subspace_test_hbd::GetProjSubspaceTestHBD>::
     IsValidParamName(string *name)

{
  bool bVar1;
  ulong uVar2;
  size_type index;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = name->_M_string_length;
  if (uVar2 == 0) {
    bVar4 = false;
  }
  else {
    uVar3 = 0;
    while (bVar4 = uVar2 <= uVar3, !bVar4) {
      bVar1 = IsAlNum((name->_M_dataplus)._M_p[uVar3]);
      if ((!bVar1) && ((name->_M_dataplus)._M_p[uVar3] != '_')) {
        return bVar4;
      }
      uVar3 = uVar3 + 1;
      uVar2 = name->_M_string_length;
    }
  }
  return bVar4;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }